

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator/(char lhs,
         SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
         rhs)

{
  bool bVar1;
  uint uVar2;
  uint in_ESI;
  char in_DIL;
  char ret;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  result;
  uint *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  uint uVar3;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_10;
  char local_9;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_8;
  uint local_4;
  
  local_9 = in_DIL;
  local_8.m_int = in_ESI;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt(&local_10);
  bVar1 = DivisionCornerCaseHelper<unsigned_int,_signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_0>
          ::DivisionCornerCase1(local_9,local_8,&local_10);
  if (bVar1) {
    local_4 = local_10.m_int;
  }
  else {
    bVar1 = DivisionCornerCaseHelper2<unsigned_int,_signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_0>
            ::DivisionCornerCase2(local_9,local_8,&local_10);
    if (bVar1) {
      local_4 = local_10.m_int;
    }
    else {
      uVar3 = in_stack_ffffffffffffffe4 & 0xffffff;
      uVar2 = SafeInt::operator_cast_to_unsigned_int
                        ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          *)(CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0) &
                            0xffffffffffffff));
      DivisionHelper<signed_char,unsigned_int,2>::
      DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                ((char *)CONCAT44(uVar3,uVar2),in_stack_ffffffffffffffd8,(char *)0x1a9eda);
      SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
      ::SafeInt<signed_char>
                ((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  *)CONCAT44(uVar3,uVar2),(char *)in_stack_ffffffffffffffd8);
    }
  }
  return (SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
          )local_4;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}